

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_retry_aead(void)

{
  int cond;
  size_t sVar1;
  ptls_aead_context_t *retry_aead;
  size_t off;
  uint8_t packet_bytes [36];
  quicly_decoded_packet_t decoded;
  
  packet_bytes[0x10] = 'o';
  packet_bytes[0x11] = 'k';
  packet_bytes[0x12] = 'e';
  packet_bytes[0x13] = 'n';
  packet_bytes[0x14] = 0xd1;
  packet_bytes[0x15] = 'i';
  packet_bytes[0x16] = '&';
  packet_bytes[0x17] = 0xd8;
  packet_bytes[0x18] = '\x1f';
  packet_bytes[0x19] = 'o';
  packet_bytes[0x1a] = 0x9c;
  packet_bytes[0x1b] = 0xa2;
  packet_bytes[0x1c] = 0x95;
  packet_bytes[0x1d] = ':';
  packet_bytes[0x1e] = 0x8a;
  packet_bytes[0x1f] = 0xa4;
  packet_bytes[0] = 0xff;
  packet_bytes[1] = 0xff;
  packet_bytes[2] = '\0';
  packet_bytes[3] = '\0';
  packet_bytes[4] = '\x1d';
  packet_bytes[5] = '\0';
  packet_bytes[6] = '\b';
  packet_bytes[7] = 0xf0;
  packet_bytes[8] = 'g';
  packet_bytes[9] = 0xa5;
  packet_bytes[10] = 'P';
  packet_bytes[0xb] = '*';
  packet_bytes[0xc] = 'B';
  packet_bytes[0xd] = 'b';
  packet_bytes[0xe] = 0xb5;
  packet_bytes[0xf] = 't';
  packet_bytes[0x20] = 'W';
  packet_bytes[0x21] = '^';
  packet_bytes[0x22] = '\x1e';
  packet_bytes[0x23] = 'I';
  off = 0;
  sVar1 = quicly_decode_packet(&quic_ctx,&decoded,packet_bytes,0x24,&off);
  _ok((uint)(sVar1 == 0x24),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x10c)
  ;
  _ok((uint)(off == 0x24),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x10d)
  ;
  retry_aead = create_retry_aead(&quic_ctx,0xff00001d,0);
  cond = validate_retry_tag(&decoded,(quicly_cid_t *)&DAT_00131a70,retry_aead);
  _ok(cond,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x111)
  ;
  ptls_aead_free(retry_aead);
  return;
}

Assistant:

static void test_retry_aead(void)
{
    quicly_cid_t odcid = {{0x83, 0x94, 0xc8, 0xf0, 0x3e, 0x51, 0x57, 0x08}, 8};
    uint8_t packet_bytes[] = {0xff, 0xff, 0x00, 0x00, 0x1d, 0x00, 0x08, 0xf0, 0x67, 0xa5, 0x50, 0x2a,
                              0x42, 0x62, 0xb5, 0x74, 0x6f, 0x6b, 0x65, 0x6e, 0xd1, 0x69, 0x26, 0xd8,
                              0x1f, 0x6f, 0x9c, 0xa2, 0x95, 0x3a, 0x8a, 0xa4, 0x57, 0x5e, 0x1e, 0x49};

    /* decode (see `test_vector` for the rationale of overwriting the version) */
    quicly_decoded_packet_t decoded;
    size_t off = 0, decoded_len = quicly_decode_packet(&quic_ctx, &decoded, packet_bytes, sizeof(packet_bytes), &off);
    ok(decoded_len == sizeof(packet_bytes));
    ok(off == sizeof(packet_bytes));

    /* decrypt */
    ptls_aead_context_t *retry_aead = create_retry_aead(&quic_ctx, QUICLY_PROTOCOL_VERSION_CURRENT, 0);
    ok(validate_retry_tag(&decoded, &odcid, retry_aead));
    ptls_aead_free(retry_aead);
}